

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteFieldDocComment(Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor *this;
  string local_78;
  string local_58;
  string local_38;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  local_18 = field;
  field_local = (FieldDescriptor *)printer;
  io::Printer::Print<>(printer,"/**\n");
  WriteDocCommentBody<google::protobuf::FieldDescriptor>((Printer *)field_local,local_18);
  this = field_local;
  FieldDescriptor::DebugString_abi_cxx11_(&local_78,local_18);
  FirstLineOf(&local_58,&local_78);
  EscapeJavadoc(&local_38,&local_58);
  io::Printer::Print<char[4],std::__cxx11::string>
            ((Printer *)this," * <code>$def$</code>\n",(char (*) [4])0x7c6934,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  io::Printer::Print<>((Printer *)field_local," */\n");
  return;
}

Assistant:

void WriteFieldDocComment(io::Printer* printer, const FieldDescriptor* field) {
  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then continue with the field declaration,
  // e.g.:
  //   optional string foo = 5;
  // And then we end with the javadoc tags if applicable.
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field);
  printer->Print(" * <code>$def$</code>\n", "def",
                 EscapeJavadoc(FirstLineOf(field->DebugString())));
  printer->Print(" */\n");
}